

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

string * __thiscall
compiler::AssemblerCompiler::do_declaration_abi_cxx11_
          (string *__return_storage_ptr__,AssemblerCompiler *this,Declaration *declaration)

{
  bool bVar1;
  reference ppVVar2;
  socklen_t *in_RCX;
  undefined1 local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Var *local_48;
  Var *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<compiler::Var_*,_std::allocator<compiler::Var_*>_> *__range1;
  Declaration *declaration_local;
  AssemblerCompiler *this_local;
  string *temp;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1 = std::vector<compiler::Var_*,_std::allocator<compiler::Var_*>_>::begin
                     (&declaration->variables);
  i = (Var *)std::vector<compiler::Var_*,_std::allocator<compiler::Var_*>_>::end
                       (&declaration->variables);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<compiler::Var_*const_*,_std::vector<compiler::Var_*,_std::allocator<compiler::Var_*>_>_>
                                     *)&i), bVar1) {
    ppVVar2 = __gnu_cxx::
              __normal_iterator<compiler::Var_*const_*,_std::vector<compiler::Var_*,_std::allocator<compiler::Var_*>_>_>
              ::operator*(&__end1);
    local_48 = *ppVVar2;
    Var::accept_abi_cxx11_((Var *)local_a8,(int)local_48,(sockaddr *)this,in_RCX);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_a8 + 0x20),"DECL ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
    std::operator+(&local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_a8 + 0x20),";");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)(local_a8 + 0x20));
    std::__cxx11::string::~string((string *)local_a8);
    __gnu_cxx::
    __normal_iterator<compiler::Var_*const_*,_std::vector<compiler::Var_*,_std::allocator<compiler::Var_*>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AssemblerCompiler::do_declaration(const Declaration *declaration) {
    std::string temp;
    for (auto i : declaration->variables) {
        temp += "DECL " + i->accept(this) + ";";
    }
    return temp;
}